

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_183::InfoCollector::isRelevant(InfoCollector *this,Type type)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type local_40;
  Type type_local;
  Iterator __begin3;
  
  if (((InfoCollector *)0x1 < this) && (((ulong)this & 1) != 0 && (InfoCollector *)0x6 < this)) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_40.id = (uintptr_t)this;
    type_local.id = (uintptr_t)&local_40;
    pTVar2 = (Type *)wasm::Type::size(&local_40);
    if (pTVar2 != (Type *)0x0) {
      do {
        pTVar3 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
        bVar1 = isRelevant((InfoCollector *)pTVar3->id,type);
        if (bVar1) break;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                != pTVar2) || ((Type *)type_local.id != &local_40));
    }
  }
  return (InfoCollector *)0x1 < this;
}

Assistant:

bool isRelevant(Type type) {
    if (type == Type::unreachable || type == Type::none) {
      return false;
    }
    if (type.isTuple()) {
      for (auto t : type) {
        if (isRelevant(t)) {
          return true;
        }
      }
    }
    return true;
  }